

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<void> __thiscall
kj::anon_unknown_31::NetworkAddressHttpClient::applyTimeouts(NetworkAddressHttpClient *this)

{
  Disposer *pDVar1;
  _func_int *p_Var2;
  _func_int *p_Var3;
  PromiseNode *pPVar4;
  int iVar5;
  TransformPromiseNodeBase *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ImmediatePromiseNode<kj::_::Void> *extraout_RDX;
  ImmediatePromiseNode<kj::_::Void> *extraout_RDX_00;
  _func_int **in_RSI;
  Own<kj::_::ImmediatePromiseNode<kj::_::Void>_> OVar6;
  Own<kj::_::PromiseNode> local_58;
  Own<kj::_::PromiseNode> local_48;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  if (in_RSI[0x12] == in_RSI[0xe]) {
    *(undefined1 *)((long)in_RSI + 0x4c) = 0;
    if ((*(int *)(in_RSI + 9) == 0) && (p_Var2 = in_RSI[8], p_Var2 != (_func_int *)0x0)) {
      (*(code *)**(undefined8 **)p_Var2)(p_Var2,&local_38);
      p_Var2 = in_RSI[7];
      p_Var3 = in_RSI[8];
      in_RSI[7] = (_func_int *)0x0;
      in_RSI[8] = (_func_int *)0x0;
      if (p_Var3 != (_func_int *)0x0) {
        (*(code *)**(undefined8 **)p_Var2)(p_Var2,p_Var3 + *(long *)(*(long *)p_Var3 + -0x10));
      }
    }
    OVar6 = heap<kj::_::ImmediatePromiseNode<kj::_::Void>,kj::_::Void>((Void *)&local_38);
    (this->super_HttpClient)._vptr_HttpClient = (_func_int **)CONCAT44(uStack_34,local_38);
    this->timer = (Timer *)CONCAT44(uStack_2c,uStack_30);
  }
  else {
    pDVar1 = *(Disposer **)(in_RSI[0xe] + 0x10);
    (**(code **)(*(long *)in_RSI[1] + 8))(&local_58,in_RSI[1],pDVar1);
    this_00 = (TransformPromiseNodeBase *)operator_new(0x38);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_58,
               _::
               TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:3719:38),_kj::_::PropagateException>
               ::anon_class_16_2_3fe63c88_for_func::operator());
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00444b90;
    this_00[1].super_PromiseNode._vptr_PromiseNode = in_RSI;
    this_00[1].dependency.disposer = pDVar1;
    local_48.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,kj::(anonymous_namespace)::NetworkAddressHttpClient::applyTimeouts()::{lambda()#1},kj::_::PropagateException>>
          ::instance;
    local_48.ptr = (PromiseNode *)this_00;
    OVar6 = (Own<kj::_::ImmediatePromiseNode<kj::_::Void>_>)
            heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_38,&local_48);
    pPVar4 = local_48.ptr;
    *(undefined4 *)&(this->super_HttpClient)._vptr_HttpClient = local_38;
    *(undefined4 *)((long)&(this->super_HttpClient)._vptr_HttpClient + 4) = uStack_34;
    *(undefined4 *)&this->timer = uStack_30;
    *(undefined4 *)((long)&this->timer + 4) = uStack_2c;
    if ((TransformPromiseNodeBase *)local_48.ptr != (TransformPromiseNodeBase *)0x0) {
      local_48.ptr = (PromiseNode *)0x0;
      iVar5 = (**(local_48.disposer)->_vptr_Disposer)
                        (local_48.disposer,
                         ((PromiseNode *)&pPVar4->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                         (long)&((PromiseNode *)&pPVar4->_vptr_PromiseNode)->_vptr_PromiseNode);
      OVar6.disposer._4_4_ = extraout_var;
      OVar6.disposer._0_4_ = iVar5;
      OVar6.ptr = extraout_RDX;
    }
    pPVar4 = local_58.ptr;
    if (local_58.ptr != (PromiseNode *)0x0) {
      local_58.ptr = (PromiseNode *)0x0;
      iVar5 = (**(local_58.disposer)->_vptr_Disposer)
                        (local_58.disposer,
                         pPVar4->_vptr_PromiseNode[-2] + (long)&pPVar4->_vptr_PromiseNode);
      OVar6.disposer._4_4_ = extraout_var_00;
      OVar6.disposer._0_4_ = iVar5;
      OVar6.ptr = extraout_RDX_00;
    }
  }
  return (PromiseBase)(PromiseBase)OVar6;
}

Assistant:

kj::Promise<void> applyTimeouts() {
    if (availableClients.empty()) {
      timeoutsScheduled = false;
      if (activeConnectionCount == 0) {
        KJ_IF_MAYBE(f, drainedFulfiller) {
          f->get()->fulfill();
          drainedFulfiller = nullptr;
        }
      }
      return kj::READY_NOW;
    } else {
      auto time = availableClients.front().expires;
      return timer.atTime(time).then([this,time]() {
        while (!availableClients.empty() && availableClients.front().expires <= time) {
          availableClients.pop_front();
        }
        return applyTimeouts();
      });
    }
  }